

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O1

int ERKStepSetTable(void *arkode_mem,ARKodeButcherTable B)

{
  int iVar1;
  ARKodeButcherTable B_00;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem local_38;
  ARKodeMem local_30;
  int local_28;
  int local_24;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepSetTable",&local_30,&local_38);
  if (iVar1 == 0) {
    if (B != (ARKodeButcherTable)0x0) {
      local_38->stages = 0;
      local_38->q = 0;
      local_38->p = 0;
      ARKodeButcherTable_Space(local_38->B,&local_28,&local_24);
      ARKodeButcherTable_Free(local_38->B);
      local_38->B = (ARKodeButcherTable)0x0;
      local_30->liw = local_30->liw - (long)local_28;
      local_30->lrw = local_30->lrw - (long)local_24;
      local_38->stages = B->stages;
      iVar1 = B->p;
      local_38->q = B->q;
      local_38->p = iVar1;
      B_00 = ARKodeButcherTable_Copy(B);
      local_38->B = B_00;
      if (B_00 != (ARKodeButcherTable)0x0) {
        ARKodeButcherTable_Space(B_00,&local_28,&local_24);
        local_30->liw = local_30->liw + (long)local_28;
        local_30->lrw = local_30->lrw + (long)local_24;
        return 0;
      }
    }
    iVar1 = -0x15;
    arkProcessError(local_30,-0x15,"ARKode::ERKStep","ERKStepSetTable","arkode_mem = NULL illegal.")
    ;
  }
  return iVar1;
}

Assistant:

int ERKStepSetTable(void *arkode_mem, ARKodeButcherTable B)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepSetTable",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* check for legal inputs */
  if (B == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepSetTable", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* set the relevant parameters */
  step_mem->stages = B->stages;
  step_mem->q = B->q;
  step_mem->p = B->p;

  /* copy the table into step memory */
  step_mem->B = ARKodeButcherTable_Copy(B);
  if (step_mem->B == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepSetTable", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return(ARK_SUCCESS);
}